

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O0

Abc_Obj_t * Abc_NtkFetchTwinNode(Abc_Obj_t *pNode)

{
  Abc_Ntk_t *pNtk;
  int iVar1;
  uint uVar2;
  int iVar3;
  Mio_Gate_t *pMVar4;
  Abc_Obj_t *pObj;
  Mio_Gate_t *pMVar5;
  Mio_Gate_t *pGate;
  Abc_Obj_t *pNode2;
  Abc_Obj_t *pNode_local;
  
  pMVar5 = (Mio_Gate_t *)(pNode->field_5).pData;
  iVar1 = Abc_NtkHasMapping(pNode->pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkHasMapping(pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                  ,0x31b,"Abc_Obj_t *Abc_NtkFetchTwinNode(Abc_Obj_t *)");
  }
  if ((pMVar5 != (Mio_Gate_t *)0x0) &&
     (pMVar4 = Mio_GateReadTwin(pMVar5), pMVar4 != (Mio_Gate_t *)0x0)) {
    uVar2 = Abc_ObjId(pNode);
    iVar1 = Abc_NtkObjNumMax(pNode->pNtk);
    if (uVar2 != iVar1 - 1U) {
      pNtk = pNode->pNtk;
      uVar2 = Abc_ObjId(pNode);
      pObj = Abc_NtkObj(pNtk,uVar2 + 1);
      if ((pObj != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj), iVar1 != 0)) {
        iVar1 = Abc_ObjFaninNum(pNode);
        iVar3 = Abc_ObjFaninNum(pObj);
        if (iVar1 == iVar3) {
          pMVar5 = Mio_GateReadTwin(pMVar5);
          if (pMVar5 != (Mio_Gate_t *)(pObj->field_5).pData) {
            return (Abc_Obj_t *)0x0;
          }
          return pObj;
        }
      }
    }
  }
  return (Abc_Obj_t *)0x0;
}

Assistant:

Abc_Obj_t * Abc_NtkFetchTwinNode( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNode2;
    Mio_Gate_t * pGate = (Mio_Gate_t *)pNode->pData;
    assert( Abc_NtkHasMapping(pNode->pNtk) );
    if ( pGate == NULL || Mio_GateReadTwin(pGate) == NULL )
        return NULL;
    // assuming the twin node is following next
    if ( (int)Abc_ObjId(pNode) == Abc_NtkObjNumMax(pNode->pNtk) - 1 )
        return NULL;
    pNode2 = Abc_NtkObj( pNode->pNtk, Abc_ObjId(pNode) + 1 );
    if ( pNode2 == NULL || !Abc_ObjIsNode(pNode2) || Abc_ObjFaninNum(pNode) != Abc_ObjFaninNum(pNode2) )
        return NULL;
    if ( Mio_GateReadTwin(pGate) != (Mio_Gate_t *)pNode2->pData )
        return NULL;
    return pNode2;
}